

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

CURLcode readwrite_upload(Curl_easy *data,connectdata *conn,int *didwhat)

{
  size_t sVar1;
  CURLcode CVar2;
  char *pcVar3;
  long lVar4;
  curltime cVar5;
  undefined4 uStack_74;
  HTTP *http;
  size_t fillcount;
  SingleRequest *k;
  HTTP *pHStack_50;
  _Bool sending_http_headers;
  ssize_t nread;
  size_t sStack_40;
  CURLcode result;
  ssize_t bytes_written;
  ssize_t si;
  ssize_t i;
  int *didwhat_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  k._7_1_ = 0;
  fillcount = (size_t)&data->req;
  i = (ssize_t)didwhat;
  didwhat_local = (int *)conn;
  conn_local = (connectdata *)data;
  if (((data->req).bytecount == 0) && ((data->req).writebytecount == 0)) {
    Curl_pgrsTime(data,TIMER_STARTTRANSFER);
  }
  *(uint *)i = *(uint *)i | 2;
  if (*(long *)(fillcount + 0x110) == 0) {
    nread._4_4_ = Curl_get_upload_buffer((Curl_easy *)conn_local);
    sVar1 = fillcount;
    if (nread._4_4_ != CURLE_OK) {
      return nread._4_4_;
    }
    *(undefined8 *)(fillcount + 0x118) = *(undefined8 *)&conn_local[2].ssl[1].connecting_state;
    if ((*(byte *)(fillcount + 0xf8) & 1) == 0) {
      if ((*(int *)(fillcount + 200) == 2) && (*(int *)(*(long *)(fillcount + 0x128) + 0x218) == 2))
      {
        *(undefined4 *)(fillcount + 200) = 1;
        *(uint *)(fillcount + 0xf4) = *(uint *)(fillcount + 0xf4) & 0xfffffffd;
        cVar5 = Curl_now();
        *(time_t *)(sVar1 + 0xb8) = cVar5.tv_sec;
        *(ulong *)(sVar1 + 0xc0) = CONCAT44(uStack_74,cVar5.tv_usec);
        *(uint *)i = *(uint *)i & 0xfffffffd;
        Curl_expire((Curl_easy *)conn_local,*(time_t *)(conn_local[2].chunk.hexbuffer + 8),
                    EXPIRE_100_TIMEOUT);
        return CURLE_OK;
      }
      if ((*(uint *)(*(long *)(didwhat_local + 0xf6) + 0x80) & 0x40003) != 0) {
        k._7_1_ = *(int *)(*(long *)(fillcount + 0x128) + 0x218) == 1;
      }
      CVar2 = Curl_fillreadbuffer((connectdata *)didwhat_local,(size_t)conn_local[1].send_pipe.tail,
                                  (size_t *)&http);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
      pHStack_50 = http;
    }
    else {
      pHStack_50 = (HTTP *)0x0;
    }
    nread._4_4_ = 0;
    if ((pHStack_50 == (HTTP *)0x0) && ((*(uint *)(fillcount + 0xf4) & 0x20) != 0)) {
      return CURLE_OK;
    }
    if ((long)pHStack_50 < 1) {
      CVar2 = done_sending((connectdata *)didwhat_local,(SingleRequest *)fillcount);
      if (CVar2 == CURLE_OK) {
        return CURLE_OK;
      }
      return CVar2;
    }
    *(HTTP **)(fillcount + 0x110) = pHStack_50;
    if (((k._7_1_ & 1) == 0) &&
       (((conn_local[1].read_pos & 0x1000000) != 0 ||
        (((ulong)conn_local[1].send[0] & 0x10000) != 0)))) {
      if (conn_local[2].ssl_config.cipher_list == (char *)0x0) {
        pcVar3 = (char *)(*Curl_cmalloc)((long)conn_local[1].send_pipe.tail << 1);
        conn_local[2].ssl_config.cipher_list = pcVar3;
        if (conn_local[2].ssl_config.cipher_list == (char *)0x0) {
          Curl_failf((Curl_easy *)conn_local,"Failed to alloc scratch buffer!");
          return CURLE_OUT_OF_MEMORY;
        }
      }
      bytes_written = 0;
      for (si = 0; si < (long)pHStack_50; si = si + 1) {
        if (*(char *)(*(long *)(fillcount + 0x118) + si) == '\n') {
          lVar4 = bytes_written + 1;
          conn_local[2].ssl_config.cipher_list[bytes_written] = '\r';
          conn_local[2].ssl_config.cipher_list[lVar4] = '\n';
          bytes_written = lVar4;
          if ((((ulong)conn_local[1].send[0] & 0x10000) == 0) &&
             (conn_local[2].proto.ftpc.dirs != (char **)0xffffffffffffffff)) {
            conn_local[2].proto.ftpc.dirs =
                 (char **)((long)&(conn_local[2].proto.imapc.sasl.params)->service + 1);
          }
        }
        else {
          conn_local[2].ssl_config.cipher_list[bytes_written] =
               *(char *)(*(long *)(fillcount + 0x118) + si);
        }
        bytes_written = bytes_written + 1;
      }
      if ((HTTP *)bytes_written != pHStack_50) {
        pHStack_50 = (HTTP *)bytes_written;
        *(char **)(fillcount + 0x118) = conn_local[2].ssl_config.cipher_list;
        *(ssize_t *)(fillcount + 0x110) = bytes_written;
      }
    }
  }
  nread._4_4_ = Curl_write((connectdata *)didwhat_local,didwhat_local[0x103],
                           *(void **)(fillcount + 0x118),*(size_t *)(fillcount + 0x110),
                           (ssize_t *)&stack0xffffffffffffffc0);
  if (nread._4_4_ != CURLE_OK) {
    return nread._4_4_;
  }
  if (((ulong)conn_local[1].seek_client & 1) != 0) {
    Curl_debug((Curl_easy *)conn_local,CURLINFO_DATA_OUT,*(char **)(fillcount + 0x118),sStack_40);
  }
  *(size_t *)(fillcount + 0x28) = sStack_40 + *(long *)(fillcount + 0x28);
  if ((((*(byte *)(fillcount + 0x121) & 1) == 0) || ((*(byte *)(fillcount + 0x123) & 1) != 0)) &&
     (*(char ***)(fillcount + 0x28) == conn_local[2].proto.ftpc.dirs)) {
    *(undefined1 *)(fillcount + 0xf8) = 1;
    Curl_infof((Curl_easy *)conn_local,"We are completely uploaded and fine\n");
  }
  if (*(size_t *)(fillcount + 0x110) == sStack_40) {
    nread._4_4_ = Curl_get_upload_buffer((Curl_easy *)conn_local);
    if (nread._4_4_ != CURLE_OK) {
      return nread._4_4_;
    }
    *(undefined8 *)(fillcount + 0x118) = *(undefined8 *)&conn_local[2].ssl[1].connecting_state;
    *(undefined8 *)(fillcount + 0x110) = 0;
    if (((*(byte *)(fillcount + 0xf8) & 1) != 0) &&
       (CVar2 = done_sending((connectdata *)didwhat_local,(SingleRequest *)fillcount),
       CVar2 != CURLE_OK)) {
      return CVar2;
    }
    nread._4_4_ = CURLE_OK;
  }
  else {
    *(size_t *)(fillcount + 0x110) = *(long *)(fillcount + 0x110) - sStack_40;
    *(size_t *)(fillcount + 0x118) = sStack_40 + *(long *)(fillcount + 0x118);
  }
  Curl_pgrsSetUploadCounter((Curl_easy *)conn_local,*(curl_off_t *)(fillcount + 0x28));
  return CURLE_OK;
}

Assistant:

static CURLcode readwrite_upload(struct Curl_easy *data,
                                 struct connectdata *conn,
                                 int *didwhat)
{
  ssize_t i, si;
  ssize_t bytes_written;
  CURLcode result;
  ssize_t nread; /* number of bytes read */
  bool sending_http_headers = FALSE;
  struct SingleRequest *k = &data->req;

  if((k->bytecount == 0) && (k->writebytecount == 0))
    Curl_pgrsTime(data, TIMER_STARTTRANSFER);

  *didwhat |= KEEP_SEND;

  do {

    /* only read more data if there's no upload data already
       present in the upload buffer */
    if(0 == k->upload_present) {
      result = Curl_get_upload_buffer(data);
      if(result)
        return result;
      /* init the "upload from here" pointer */
      k->upload_fromhere = data->state.ulbuf;

      if(!k->upload_done) {
        /* HTTP pollution, this should be written nicer to become more
           protocol agnostic. */
        size_t fillcount;
        struct HTTP *http = k->protop;

        if((k->exp100 == EXP100_SENDING_REQUEST) &&
           (http->sending == HTTPSEND_BODY)) {
          /* If this call is to send body data, we must take some action:
             We have sent off the full HTTP 1.1 request, and we shall now
             go into the Expect: 100 state and await such a header */
          k->exp100 = EXP100_AWAITING_CONTINUE; /* wait for the header */
          k->keepon &= ~KEEP_SEND;         /* disable writing */
          k->start100 = Curl_now();       /* timeout count starts now */
          *didwhat &= ~KEEP_SEND;  /* we didn't write anything actually */

          /* set a timeout for the multi interface */
          Curl_expire(data, data->set.expect_100_timeout, EXPIRE_100_TIMEOUT);
          break;
        }

        if(conn->handler->protocol&(PROTO_FAMILY_HTTP|CURLPROTO_RTSP)) {
          if(http->sending == HTTPSEND_REQUEST)
            /* We're sending the HTTP request headers, not the data.
               Remember that so we don't change the line endings. */
            sending_http_headers = TRUE;
          else
            sending_http_headers = FALSE;
        }

        result = Curl_fillreadbuffer(conn, data->set.upload_buffer_size,
                                     &fillcount);
        if(result)
          return result;

        nread = fillcount;
      }
      else
        nread = 0; /* we're done uploading/reading */

      if(!nread && (k->keepon & KEEP_SEND_PAUSE)) {
        /* this is a paused transfer */
        break;
      }
      if(nread <= 0) {
        result = done_sending(conn, k);
        if(result)
          return result;
        break;
      }

      /* store number of bytes available for upload */
      k->upload_present = nread;

      /* convert LF to CRLF if so asked */
      if((!sending_http_headers) && (
#ifdef CURL_DO_LINEEND_CONV
         /* always convert if we're FTPing in ASCII mode */
         (data->set.prefer_ascii) ||
#endif
         (data->set.crlf))) {
        /* Do we need to allocate a scratch buffer? */
        if(!data->state.scratch) {
          data->state.scratch = malloc(2 * data->set.upload_buffer_size);
          if(!data->state.scratch) {
            failf(data, "Failed to alloc scratch buffer!");

            return CURLE_OUT_OF_MEMORY;
          }
        }

        /*
         * ASCII/EBCDIC Note: This is presumably a text (not binary)
         * transfer so the data should already be in ASCII.
         * That means the hex values for ASCII CR (0x0d) & LF (0x0a)
         * must be used instead of the escape sequences \r & \n.
         */
        for(i = 0, si = 0; i < nread; i++, si++) {
          if(k->upload_fromhere[i] == 0x0a) {
            data->state.scratch[si++] = 0x0d;
            data->state.scratch[si] = 0x0a;
            if(!data->set.crlf) {
              /* we're here only because FTP is in ASCII mode...
                 bump infilesize for the LF we just added */
              if(data->state.infilesize != -1)
                data->state.infilesize++;
            }
          }
          else
            data->state.scratch[si] = k->upload_fromhere[i];
        }

        if(si != nread) {
          /* only perform the special operation if we really did replace
             anything */
          nread = si;

          /* upload from the new (replaced) buffer instead */
          k->upload_fromhere = data->state.scratch;

          /* set the new amount too */
          k->upload_present = nread;
        }
      }

#ifndef CURL_DISABLE_SMTP
      if(conn->handler->protocol & PROTO_FAMILY_SMTP) {
        result = Curl_smtp_escape_eob(conn, nread);
        if(result)
          return result;
      }
#endif /* CURL_DISABLE_SMTP */
    } /* if 0 == k->upload_present */
    else {
      /* We have a partial buffer left from a previous "round". Use
         that instead of reading more data */
    }

    /* write to socket (send away data) */
    result = Curl_write(conn,
                        conn->writesockfd,  /* socket to send to */
                        k->upload_fromhere, /* buffer pointer */
                        k->upload_present,  /* buffer size */
                        &bytes_written);    /* actually sent */
    if(result)
      return result;

    win_update_buffer_size(conn->writesockfd);

    if(data->set.verbose)
      /* show the data before we change the pointer upload_fromhere */
      Curl_debug(data, CURLINFO_DATA_OUT, k->upload_fromhere,
                 (size_t)bytes_written);

    k->writebytecount += bytes_written;

    if((!k->upload_chunky || k->forbidchunk) &&
       (k->writebytecount == data->state.infilesize)) {
      /* we have sent all data we were supposed to */
      k->upload_done = TRUE;
      infof(data, "We are completely uploaded and fine\n");
    }

    if(k->upload_present != bytes_written) {
      /* we only wrote a part of the buffer (if anything), deal with it! */

      /* store the amount of bytes left in the buffer to write */
      k->upload_present -= bytes_written;

      /* advance the pointer where to find the buffer when the next send
         is to happen */
      k->upload_fromhere += bytes_written;
    }
    else {
      /* we've uploaded that buffer now */
      result = Curl_get_upload_buffer(data);
      if(result)
        return result;
      k->upload_fromhere = data->state.ulbuf;
      k->upload_present = 0; /* no more bytes left */

      if(k->upload_done) {
        result = done_sending(conn, k);
        if(result)
          return result;
      }
    }

    Curl_pgrsSetUploadCounter(data, k->writebytecount);

  } WHILE_FALSE; /* just to break out from! */

  return CURLE_OK;
}